

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize.cpp
# Opt level: O0

void __thiscall
CaDiCaL::Internal::calculate_minimize_chain
          (Internal *this,int lit,vector<int,_std::allocator<int>_> *stack)

{
  int lit_00;
  bool bVar1;
  char cVar2;
  reference pvVar3;
  Flags *pFVar4;
  Var *pVVar5;
  literal_iterator piVar6;
  vector<int,_std::allocator<int>_> *in_RDX;
  int in_ESI;
  Internal *in_RDI;
  int other;
  const_literal_iterator i;
  const_literal_iterator end;
  uint64_t id;
  uint uidx;
  int lit_1;
  Var *v;
  Flags *f;
  Var *v_1;
  int idx;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  int lit_01;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  vector<int,_std::allocator<int>_> *this_00;
  int *local_58;
  
  this_00 = in_RDX;
  vidx(in_RDI,in_ESI);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (value_type_conflict3 *)in_stack_ffffffffffffff78);
  while (bVar1 = std::vector<int,_std::allocator<int>_>::empty(this_00), ((bVar1 ^ 0xffU) & 1) != 0)
  {
    pvVar3 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    lit_00 = *pvVar3;
    std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)0xdd2efa);
    lit_01 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    if (lit_00 < 0) {
      var((Internal *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),lit_01);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
                 (value_type_conflict5 *)in_RDI);
    }
    else {
      pFVar4 = flags((Internal *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     lit_01);
      pVVar5 = var((Internal *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      if (((((uint)*pFVar4 >> 1 & 1) == 0) && (((uint)*pFVar4 >> 5 & 1) == 0)) &&
         (((uint)*pFVar4 >> 2 & 1) == 0)) {
        if (pVVar5->level == 0) {
          if (((uint)*pFVar4 & 1) == 0) {
            *pFVar4 = (Flags)((uint)*pFVar4 & 0xfffffffe | 1);
            std::vector<int,_std::allocator<int>_>::push_back(this_00,&in_RDI->mode);
            cVar2 = val(in_RDI,lit_00);
            in_stack_ffffffffffffff84 = lit_00;
            if (cVar2 < '\x01') {
              in_stack_ffffffffffffff84 = -lit_00;
            }
            vlit((Internal *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
            unit_clauses((Internal *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
                       (value_type_conflict5 *)in_RDI);
          }
        }
        else {
          *pFVar4 = (Flags)((uint)*pFVar4 & 0xffffffdf | 0x20);
          piVar6 = Clause::end(pVVar5->reason);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (value_type_conflict3 *)in_stack_ffffffffffffff78);
          for (local_58 = Clause::begin(pVVar5->reason); local_58 != piVar6; local_58 = local_58 + 1
              ) {
            if (*local_58 != lit_00) {
              in_stack_ffffffffffffff78 = in_RDX;
              vidx(in_RDI,*local_58);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         (value_type_conflict3 *)in_stack_ffffffffffffff78);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Internal::calculate_minimize_chain (int lit, std::vector<int> &stack) {
  assert (stack.empty ());
  stack.push_back (vidx (lit));

  while (!stack.empty ()) {
    const int idx = stack.back ();
    assert (idx);
    stack.pop_back ();
    if (idx < 0) {
      Var &v = var (idx);
      mini_chain.push_back (v.reason->id);
      continue;
    }
    assert (idx);
    Flags &f = flags (idx);
    Var &v = var (idx);
    if (f.keep || f.added || f.poison) {
      continue;
    }
    if (!v.level) {
      if (f.seen)
        continue;
      f.seen = true;
      unit_analyzed.push_back (idx);
      const int lit = val (idx) > 0 ? idx : -idx;
      const unsigned uidx = vlit (lit); // I didn't clean added flag
      uint64_t id = unit_clauses (uidx);
      assert (id);
      unit_chain.push_back (id);
      continue;
    }
    f.added = true;
    assert (v.reason && f.removable);
    const const_literal_iterator end = v.reason->end ();
    const_literal_iterator i;
    LOG (v.reason, "LRAT chain for lit %d at depth %zd by going over", lit,
         stack.size ());
    stack.push_back (-idx);
    for (i = v.reason->begin (); i != end; i++) {
      const int other = *i;
      if (other == idx)
        continue;
      stack.push_back (vidx (other));
    }
  }
  assert (stack.empty ());
}